

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

ExpEmit __thiscall FxBoolCast::Emit(FxBoolCast *this,VMFunctionBuilder *build)

{
  undefined8 uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined8 in_RAX;
  uint opa;
  undefined4 uStack_38;
  ExpEmit from;
  undefined1 uStack_31;
  
  _uStack_38 = in_RAX;
  uVar2 = (*this->basex->_vptr_FxExpression[7])();
  uVar1 = _uStack_38;
  uStack_31 = SUB81(uVar1,7);
  _uStack_38 = CONCAT16((char)(uVar2 >> 0x10),CONCAT24((short)uVar2,uStack_38));
  if ((uVar2 >> 0x10 & 1) != 0) {
    __assert_fail("!from.Konst",
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1d1,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
  }
  iVar3 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])();
  if (((iVar3 != 0) &&
      (iVar3 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar3 != 1)) &&
     (iVar3 = (*(this->basex->ValueType->super_DObject)._vptr_DObject[0x12])(), iVar3 != 3)) {
    __assert_fail("basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1d2,"virtual ExpEmit FxBoolCast::Emit(VMFunctionBuilder *)");
  }
  uVar4 = VMFunctionBuilder::RegAvailability::Get(build->Registers,1);
  ExpEmit::Free(&from,build);
  opa = uVar4 & 0xff;
  VMFunctionBuilder::Emit(build,1,opa,0);
  if ((char)(uVar2 >> 8) == '\x03') {
    uVar5 = VMFunctionBuilder::GetConstantAddress(build,(void *)0x0,'\0');
    iVar3 = 0xb4;
  }
  else {
    uVar5 = uVar2 >> 8 & 0xff;
    if (uVar5 == 1) {
      uVar5 = VMFunctionBuilder::GetConstantFloat(build,0.0);
      iVar3 = 0x98;
    }
    else {
      if (uVar5 != 0) goto LAB_005cff2d;
      iVar3 = 0x73;
      uVar5 = opa;
    }
  }
  VMFunctionBuilder::Emit(build,iVar3,1,uVar2 & 0xff,uVar5);
LAB_005cff2d:
  VMFunctionBuilder::Emit(build,0x37,1);
  VMFunctionBuilder::Emit(build,1,opa,1);
  return (ExpEmit)((uint3)uVar4 & 0xff);
}

Assistant:

ExpEmit FxBoolCast::Emit(VMFunctionBuilder *build)
{
	ExpEmit from = basex->Emit(build);
	assert(!from.Konst);
	assert(basex->ValueType->GetRegType() == REGT_INT || basex->ValueType->GetRegType() == REGT_FLOAT || basex->ValueType->GetRegType() == REGT_POINTER);
	ExpEmit to(build, REGT_INT);
	from.Free(build);

	// Preload result with 0.
	build->Emit(OP_LI, to.RegNum, 0);

	// Check source against 0.
	if (from.RegType == REGT_INT)
	{
		build->Emit(OP_EQ_R, 1, from.RegNum, to.RegNum);
	}
	else if (from.RegType == REGT_FLOAT)
	{
		build->Emit(OP_EQF_K, 1, from.RegNum, build->GetConstantFloat(0.));
	}
	else if (from.RegType == REGT_POINTER)
	{
		build->Emit(OP_EQA_K, 1, from.RegNum, build->GetConstantAddress(nullptr, ATAG_GENERIC));
	}
	build->Emit(OP_JMP, 1);

	// Reload result with 1 if the comparison fell through.
	build->Emit(OP_LI, to.RegNum, 1);

	return to;
}